

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O2

double brotli::ShannonEntropy(uint32_t *population,size_t size,size_t *total)

{
  uint *puVar1;
  ulong uVar2;
  size_t v;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  puVar1 = population + size;
  dVar4 = 0.0;
  dVar3 = 0.0;
  v = 0;
  if ((size & 1) != 0) goto LAB_0017a89c;
  for (; population < puVar1; population = population + 1) {
    uVar2 = (ulong)*population;
    population = population + 1;
    v = v + uVar2;
    dVar3 = FastLog2(uVar2);
    dVar3 = dVar4 - dVar3 * (double)uVar2;
LAB_0017a89c:
    uVar2 = (ulong)*population;
    v = v + uVar2;
    dVar4 = FastLog2(uVar2);
    dVar4 = dVar3 - dVar4 * (double)uVar2;
  }
  if (v != 0) {
    auVar5._8_4_ = (int)(v >> 0x20);
    auVar5._0_8_ = v;
    auVar5._12_4_ = 0x45300000;
    dVar3 = FastLog2(v);
    dVar4 = dVar4 + dVar3 * ((auVar5._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0));
  }
  *total = v;
  return dVar4;
}

Assistant:

static inline double ShannonEntropy(const uint32_t *population, size_t size,
                                    size_t *total) {
  size_t sum = 0;
  double retval = 0;
  const uint32_t *population_end = population + size;
  size_t p;
  if (size & 1) {
    goto odd_number_of_elements_left;
  }
  while (population < population_end) {
    p = *population++;
    sum += p;
    retval -= static_cast<double>(p) * FastLog2(p);
 odd_number_of_elements_left:
    p = *population++;
    sum += p;
    retval -= static_cast<double>(p) * FastLog2(p);
  }
  if (sum) retval += static_cast<double>(sum) * FastLog2(sum);
  *total = sum;
  return retval;
}